

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O1

void __thiscall QUrlModel::setUrls(QUrlModel *this,QList<QUrl> *list)

{
  long lVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (**(code **)(*(long *)this + 0x78))();
  (**(code **)(*(long *)this + 0x108))(this,0,uVar2);
  QList<QUrl>::clear(&this->invalidUrls);
  QList<QUrlModel::WatchItem>::clear(&this->watching);
  addUrls(this,list,0,true);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlModel::setUrls(const QList<QUrl> &list)
{
    removeRows(0, rowCount());
    invalidUrls.clear();
    watching.clear();
    addUrls(list, 0);
}